

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O3

void __thiscall
QSharedDataPointer<QTextCursorPrivate>::detach_helper(QSharedDataPointer<QTextCursorPrivate> *this)

{
  QTextCursorPrivate *pQVar1;
  QTextCursorPrivate *this_00;
  
  this_00 = (QTextCursorPrivate *)operator_new(0x30);
  QTextCursorPrivate::QTextCursorPrivate(this_00,(this->d).ptr);
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  pQVar1 = (this->d).ptr;
  LOCK();
  (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + -1);
  UNLOCK();
  if ((__int_type)
      (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int> == 0) {
    pQVar1 = (this->d).ptr;
    if (pQVar1 != (QTextCursorPrivate *)0x0) {
      QTextCursorPrivate::~QTextCursorPrivate(pQVar1);
    }
    operator_delete(pQVar1,0x30);
  }
  (this->d).ptr = this_00;
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QSharedDataPointer<T>::detach_helper()
{
    T *x = clone();
    x->ref.ref();
    if (!d.get()->ref.deref())
        delete d.get();
    d.reset(x);
}